

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool __thiscall wallet::SQLiteBatch::HasKey(SQLiteBatch *this,DataStream *key)

{
  long lVar1;
  byte bVar2;
  int iVar3;
  allocator<char> *in_RDI;
  long in_FS_OFFSET;
  int res;
  Span<const_std::byte> in_stack_00000020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  allocator<char> *__a;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  bool bVar4;
  allocator<char> in_stack_ffffffffffffffc7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe4;
  sqlite3_stmt *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(*(long *)(in_RDI + 8) + 200) == 0) {
    bVar4 = false;
  }
  else {
    if (*(long *)(in_RDI + 0x18) == 0) {
      __assert_fail("m_read_stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x229,"virtual bool wallet::SQLiteBatch::HasKey(DataStream &&)");
    }
    __a = in_RDI;
    Span<const_std::byte>::Span<DataStream>
              (*(Span<const_std::byte> **)(in_RDI + 0x18),
               (DataStream *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,
                                 CONCAT15(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80))),
               in_stack_ffffffffffffff78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffc8,
               (char *)CONCAT17(in_stack_ffffffffffffffc7,
                                CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),__a);
    bVar4 = BindBlobToStatement(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4,
                                in_stack_00000020,in_stack_ffffffffffffffd8);
    bVar2 = bVar4 ^ 0xff;
    std::__cxx11::string::~string(in_stack_ffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    if ((bVar2 & 1) == 0) {
      iVar3 = sqlite3_step(*(undefined8 *)(in_RDI + 0x18));
      sqlite3_clear_bindings(*(undefined8 *)(in_RDI + 0x18));
      sqlite3_reset(*(undefined8 *)(in_RDI + 0x18));
      bVar4 = iVar3 == 100;
    }
    else {
      bVar4 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::HasKey(DataStream&& key)
{
    if (!m_database.m_db) return false;
    assert(m_read_stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(m_read_stmt, 1, key, "key")) return false;
    int res = sqlite3_step(m_read_stmt);
    sqlite3_clear_bindings(m_read_stmt);
    sqlite3_reset(m_read_stmt);
    return res == SQLITE_ROW;
}